

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaDeviceIndex Pa_HostApiDeviceIndexToDeviceIndex(PaHostApiIndex hostApi,int hostApiDeviceIndex)

{
  int local_14;
  PaDeviceIndex result;
  int hostApiDeviceIndex_local;
  PaHostApiIndex hostApi_local;
  
  if (initializationCount_ == 0) {
    local_14 = -10000;
  }
  else if ((hostApi < 0) || (hostApisCount_ <= hostApi)) {
    local_14 = -0x26fa;
  }
  else if ((hostApiDeviceIndex < 0) ||
          ((hostApis_[hostApi]->info).deviceCount <= hostApiDeviceIndex)) {
    local_14 = -0x270c;
  }
  else {
    local_14 = (int)(hostApis_[hostApi]->privatePaFrontInfo).baseDeviceIndex + hostApiDeviceIndex;
  }
  return local_14;
}

Assistant:

PaDeviceIndex Pa_HostApiDeviceIndexToDeviceIndex( PaHostApiIndex hostApi, int hostApiDeviceIndex )
{
    PaDeviceIndex result;

    PA_LOGAPI_ENTER_PARAMS( "Pa_HostApiDeviceIndexToPaDeviceIndex" );
    PA_LOGAPI(("\tPaHostApiIndex hostApi: %d\n", hostApi ));
    PA_LOGAPI(("\tint hostApiDeviceIndex: %d\n", hostApiDeviceIndex ));

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        if( hostApi < 0 || hostApi >= hostApisCount_ )
        {
            result = paInvalidHostApi;
        }
        else
        {
            if( hostApiDeviceIndex < 0 ||
                    hostApiDeviceIndex >= hostApis_[hostApi]->info.deviceCount )
            {
                result = paInvalidDevice;
            }
            else
            {
                result = hostApis_[hostApi]->privatePaFrontInfo.baseDeviceIndex + hostApiDeviceIndex;
            }
        }
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_HostApiDeviceIndexToPaDeviceIndex", "PaDeviceIndex: %d", result );

    return result;
}